

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void error_handler_cb(exr_const_context_t f,int code,char *msg)

{
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  char *fn;
  char *local_20;
  undefined8 local_18;
  undefined4 local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  iVar2 = exr_get_file_name(in_RDI,&local_20);
  __stream = _stderr;
  if (iVar2 != 0) {
    local_20 = "<error>";
  }
  pcVar1 = local_20;
  uVar3 = exr_get_error_code_as_string(local_c);
  fprintf(__stream,"ERROR \'%s\' (%s): %s\n",pcVar1,uVar3,local_18);
  return;
}

Assistant:

static void
error_handler_cb (exr_const_context_t f, int code, const char* msg)
{
    const char* fn;
    if (EXR_ERR_SUCCESS != exr_get_file_name (f, &fn)) fn = "<error>";
    fprintf (
        stderr,
        "ERROR '%s' (%s): %s\n",
        fn,
        exr_get_error_code_as_string (code),
        msg);
}